

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O2

void __thiscall setup::windows_version::data::load(data *this,istream *is,version *version)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (0x10312ff < version->value) {
    uVar2 = util::load<short,util::little_endian>(is);
    uVar3 = (uint)uVar2;
  }
  this->build = uVar3;
  bVar1 = util::load<unsigned_char,util::little_endian>(is);
  this->minor = (uint)bVar1;
  bVar1 = util::load<unsigned_char,util::little_endian>(is);
  this->major = (uint)bVar1;
  return;
}

Assistant:

void windows_version::data::load(std::istream & is, const version & version) {
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		build = util::load<boost::uint16_t>(is);
	} else {
		build = 0;
	}
	
	minor = util::load<boost::uint8_t>(is);
	major = util::load<boost::uint8_t>(is);
	
}